

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O2

string * __thiscall
lambda::parse_from(std::istream&)::helper::get_var_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  int iVar2;
  Parse_error *this_00;
  Shared_string local_30;
  
  while( true ) {
    parse_from::helper::eat_whitespace((helper *)this);
    iVar1 = std::istream::get();
    if (iVar1 != 0x28) break;
    iVar2 = std::istream::peek();
    if (iVar2 != 0x2a) break;
    std::istream::get();
    parse_from::helper::comment((helper *)this);
  }
  iVar2 = isalpha(iVar1);
  if ((iVar1 != 0x5f) && (iVar2 == 0)) {
    this_00 = (Parse_error *)__cxa_allocate_exception(0x20);
    ublib::Shared_string::Shared_string(&local_30,"expected a variable");
    Parse_error::Parse_error(this_00,&local_30);
    __cxa_throw(this_00,&Parse_error::typeinfo,Parse_error::~Parse_error);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  while( true ) {
    iVar1 = std::istream::peek();
    iVar2 = isalnum(iVar1);
    if (((iVar2 == 0) && (iVar1 != 0x5f)) && (iVar1 != 0x27)) break;
    std::istream::get();
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_var() {
      eat_whitespace();
      auto ch = inp.get();

      if (ch == '(' and inp.peek() == '*') {
        inp.get();
        comment();
        return get_var();
      }

      if (not(std::isalpha(ch) or ch == '_')) {
        throw Parse_error("expected a variable");
      }

      std::string buffer;
      buffer.push_back(static_cast<char>(ch));
      for (;;) {
        ch = inp.peek();
        if (std::isalnum(ch) or ch == '_' or ch == '\'') {
          inp.get();
          buffer.push_back(static_cast<char>(ch));
        } else {
          break;
        }
      }
      return buffer;
    }